

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_rel_prop
                   (string *__return_storage_ptr__,Property *prop,string *name,uint32_t indent)

{
  ostream *poVar1;
  uint32_t n;
  ListEditQual extraout_EDX;
  ListEditQual extraout_EDX_00;
  ListEditQual extraout_EDX_01;
  ListEditQual v;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((prop->_type & ~Attrib) == Relation) {
    pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    v = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      v = extraout_EDX_00;
    }
    if (prop->_has_custom == true) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"custom ",7);
      v = extraout_EDX_01;
    }
    if (prop->_listOpQual != ResetToExplicit) {
      to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)prop->_listOpQual,v);
      poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((prop->_rel)._varying_authored == true) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"varying ",8);
    }
    anon_unknown_173::print_rel_only(&local_1d8,&prop->_rel,name,indent);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_rel_prop(const Property &prop, const std::string &name,
                           uint32_t indent) {
  std::stringstream ss;

  if (!prop.is_relationship()) {
    return ss.str();
  }

  ss << pprint::Indent(indent);

  if (prop.has_custom()) {
    ss << "custom ";
  }

  // List editing
  if (prop.get_listedit_qual() != ListEditQual::ResetToExplicit) {
    ss << to_string(prop.get_listedit_qual()) << " ";
  }

  const Relationship &rel = prop.get_relationship();
  if (rel.is_varying_authored()) {
    ss << "varying ";
  }

  ss << print_rel_only(rel, name, indent);

  return ss.str();
}